

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

_Bool find_any_nearby_injured_kin(chunk *c,monster_conflict *mon)

{
  bool bVar1;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  loc grid;
  wchar_t wVar4;
  
  wVar2 = (mon->grid).y + L'\xfffffffb';
  do {
    wVar4 = (mon->grid).x + L'\xfffffffa';
    do {
      wVar4 = wVar4 + L'\x01';
      grid.y = wVar2;
      grid.x = wVar4;
      pmVar3 = get_injured_kin(c,mon,grid);
      if (pmVar3 != (monster_conflict *)0x0) goto LAB_00179ca1;
    } while (wVar4 < (mon->grid).x + L'\x05');
    bVar1 = wVar2 < (mon->grid).y + L'\x05';
    wVar2 = wVar2 + L'\x01';
  } while (bVar1);
LAB_00179ca1:
  return pmVar3 != (monster_conflict *)0x0;
}

Assistant:

bool find_any_nearby_injured_kin(struct chunk *c, const struct monster *mon)
{
	struct loc grid;
	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			if (get_injured_kin(c, mon, grid) != NULL) {
				return true;
			}
		}
	}

	return false;
}